

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O0

void pkcs12_fill_buffer(uchar *data,size_t data_len,uchar *filler,size_t fill_len)

{
  uchar *local_40;
  size_t use_len;
  uchar *p;
  size_t fill_len_local;
  uchar *filler_local;
  size_t data_len_local;
  uchar *data_local;
  
  use_len = (size_t)data;
  for (filler_local = (uchar *)data_len; filler_local != (uchar *)0x0;
      filler_local = filler_local + -(long)local_40) {
    local_40 = (uchar *)fill_len;
    if (filler_local <= fill_len) {
      local_40 = filler_local;
    }
    memcpy((void *)use_len,filler,(size_t)local_40);
    use_len = (size_t)(local_40 + use_len);
  }
  return;
}

Assistant:

static void pkcs12_fill_buffer( unsigned char *data, size_t data_len,
                                const unsigned char *filler, size_t fill_len )
{
    unsigned char *p = data;
    size_t use_len;

    while( data_len > 0 )
    {
        use_len = ( data_len > fill_len ) ? fill_len : data_len;
        memcpy( p, filler, use_len );
        p += use_len;
        data_len -= use_len;
    }
}